

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TempInputText
               (ImRect *bb,ImGuiID id,char *label,char *buf,int buf_size,ImGuiInputTextFlags flags)

{
  int buf_size_00;
  char *buf_00;
  char *label_00;
  ImVec2 local_44;
  undefined1 local_3a;
  byte local_39;
  bool value_changed;
  ImGuiContext *pIStack_38;
  bool init;
  ImGuiContext *g;
  ImGuiInputTextFlags flags_local;
  int buf_size_local;
  char *buf_local;
  char *label_local;
  ImRect *pIStack_10;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIStack_38 = GImGui;
  local_39 = GImGui->TempInputId != id;
  g._0_4_ = flags;
  g._4_4_ = buf_size;
  _flags_local = buf;
  buf_local = label;
  label_local._4_4_ = id;
  pIStack_10 = bb;
  if ((bool)local_39) {
    ClearActiveID();
  }
  label_00 = buf_local;
  buf_00 = _flags_local;
  buf_size_00 = g._4_4_;
  (pIStack_38->CurrentWindow->DC).CursorPos = pIStack_10->Min;
  local_44 = ImRect::GetSize(pIStack_10);
  local_3a = InputTextEx(label_00,(char *)0x0,buf_00,buf_size_00,&local_44,(ImGuiInputTextFlags)g,
                         (ImGuiInputTextCallback)0x0,(void *)0x0);
  if ((local_39 & 1) != 0) {
    if (pIStack_38->ActiveId != label_local._4_4_) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                    ,0xb6f,
                    "bool ImGui::TempInputText(const ImRect &, ImGuiID, const char *, char *, int, ImGuiInputTextFlags)"
                   );
    }
    pIStack_38->TempInputId = pIStack_38->ActiveId;
  }
  return (bool)local_3a;
}

Assistant:

bool ImGui::TempInputText(const ImRect& bb, ImGuiID id, const char* label, char* buf, int buf_size, ImGuiInputTextFlags flags)
{
    // On the first frame, g.TempInputTextId == 0, then on subsequent frames it becomes == id.
    // We clear ActiveID on the first frame to allow the InputText() taking it back.
    ImGuiContext& g = *GImGui;
    const bool init = (g.TempInputId != id);
    if (init)
        ClearActiveID();

    g.CurrentWindow->DC.CursorPos = bb.Min;
    bool value_changed = InputTextEx(label, NULL, buf, buf_size, bb.GetSize(), flags);
    if (init)
    {
        // First frame we started displaying the InputText widget, we expect it to take the active id.
        IM_ASSERT(g.ActiveId == id);
        g.TempInputId = g.ActiveId;
    }
    return value_changed;
}